

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::debugging_internal::DemangleString_abi_cxx11_
          (string *__return_storage_ptr__,debugging_internal *this,char *mangled)

{
  void *__ptr;
  char *demangled;
  int status;
  char *mangled_local;
  string *out;
  
  demangled._7_1_ = 0;
  _status = this;
  mangled_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  demangled._0_4_ = 0;
  __ptr = (void *)__cxa_demangle(_status,0,0,&demangled);
  if (((int)demangled == 0) && (__ptr != (void *)0x0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    free(__ptr);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DemangleString(const char* mangled) {
  std::string out;
  int status = 0;
  char* demangled = nullptr;
#if ABSL_INTERNAL_HAS_CXA_DEMANGLE
  demangled = abi::__cxa_demangle(mangled, nullptr, nullptr, &status);
#endif
  if (status == 0 && demangled != nullptr) {
    out.append(demangled);
    free(demangled);
  } else {
    out.append(mangled);
  }
  return out;
}